

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O1

int run_test_getnameinfo_basic_ip4(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  sockaddr_in *in_RCX;
  long extraout_RDX;
  int iVar2;
  uv_loop_t *puVar3;
  
  puVar3 = (uv_loop_t *)0x1a4b5a;
  iVar2 = 0x50;
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  if (iVar1 == 0) {
    puVar3 = uv_default_loop();
    iVar2 = 0x2fdcb0;
    in_RCX = &addr4;
    iVar1 = uv_getnameinfo(puVar3,&req,getnameinfo_req,(sockaddr *)&addr4,0);
    if (iVar1 != 0) goto LAB_00159396;
    puVar3 = uv_default_loop();
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    iVar2 = 0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getnameinfo_basic_ip4_cold_1();
LAB_00159396:
    run_test_getnameinfo_basic_ip4_cold_2();
  }
  run_test_getnameinfo_basic_ip4_cold_3();
  if (puVar3 == (uv_loop_t *)0x0) {
    getnameinfo_req_cold_4();
LAB_001593bb:
    getnameinfo_req_cold_1();
LAB_001593c0:
    getnameinfo_req_cold_3();
  }
  else {
    if (iVar2 != 0) goto LAB_001593bb;
    if (extraout_RDX == 0) goto LAB_001593c0;
    if (in_RCX != (sockaddr_in *)0x0) {
      return extraout_EAX;
    }
  }
  getnameinfo_req_cold_2();
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  if (iVar1 == 0) {
    puVar3 = uv_default_loop();
    iVar1 = uv_getnameinfo(puVar3,&req,(uv_getnameinfo_cb)0x0,(sockaddr *)&addr4,0);
    if (iVar1 != 0) goto LAB_0015945a;
    if (req.host[0] == '\0') goto LAB_0015945f;
    if (req.service[0] == '\0') goto LAB_00159464;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getnameinfo_basic_ip4_sync_cold_1();
LAB_0015945a:
    run_test_getnameinfo_basic_ip4_sync_cold_2();
LAB_0015945f:
    run_test_getnameinfo_basic_ip4_sync_cold_5();
LAB_00159464:
    run_test_getnameinfo_basic_ip4_sync_cold_4();
  }
  run_test_getnameinfo_basic_ip4_sync_cold_3();
  puVar3 = (uv_loop_t *)0x199c09;
  iVar1 = uv_ip6_addr("::1",0x50,&addr6);
  if (iVar1 == 0) {
    puVar3 = uv_default_loop();
    iVar1 = uv_getnameinfo(puVar3,&req,getnameinfo_req,(sockaddr *)&addr6,0);
    if (iVar1 == 0) {
      puVar3 = uv_default_loop();
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00159505;
    }
  }
  else {
    run_test_getnameinfo_basic_ip6_cold_1();
  }
  run_test_getnameinfo_basic_ip6_cold_2();
LAB_00159505:
  run_test_getnameinfo_basic_ip6_cold_3();
  iVar1 = uv_is_closing((uv_handle_t *)puVar3);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar3,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip4) {
  int r;

  r = uv_ip4_addr(address_ip4, port, &addr4);
  ASSERT(r == 0);

  r = uv_getnameinfo(uv_default_loop(),
                     &req,
                     &getnameinfo_req,
                     (const struct sockaddr*)&addr4,
                     0);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}